

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
FuncBailOutData::Initialize(FuncBailOutData *this,Func *func,JitArenaAllocator *tempAllocator)

{
  RegSlot length;
  JITTimeFunctionBody *this_00;
  int *piVar1;
  BVFixed *pBVar2;
  
  this_00 = Func::GetJITFunctionBody(func);
  length = JITTimeFunctionBody::GetLocalsCount(this_00);
  this->func = func;
  piVar1 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                     ((Memory *)tempAllocator,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                      (ulong)length);
  this->localOffsets = piVar1;
  pBVar2 = BVFixed::New<Memory::JitArenaAllocator>(length,tempAllocator,false);
  this->losslessInt32Syms = pBVar2;
  pBVar2 = BVFixed::New<Memory::JitArenaAllocator>(length,tempAllocator,false);
  this->float64Syms = pBVar2;
  return;
}

Assistant:

void
FuncBailOutData::Initialize(Func * func, JitArenaAllocator * tempAllocator)
{
    Js::RegSlot localsCount = func->GetJITFunctionBody()->GetLocalsCount();
    this->func = func;
    this->localOffsets = AnewArrayZ(tempAllocator, int, localsCount);
    this->losslessInt32Syms = BVFixed::New(localsCount, tempAllocator);
    this->float64Syms = BVFixed::New(localsCount, tempAllocator);
}